

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHie.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkConvertBlackboxes(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  undefined4 uVar2;
  long *plVar3;
  Abc_Ntk_t *pAVar4;
  long lVar5;
  int iVar6;
  Abc_Ntk_t *pNtk_00;
  char *pcVar7;
  int *piVar8;
  Abc_Obj_t *pAVar9;
  Vec_Ptr_t *pVVar10;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  long extraout_RDX_06;
  long extraout_RDX_07;
  long extraout_RDX_08;
  long extraout_RDX_09;
  long extraout_RDX_10;
  long extraout_RDX_11;
  long extraout_RDX_12;
  long extraout_RDX_13;
  long extraout_RDX_14;
  long lVar11;
  long extraout_RDX_15;
  long extraout_RDX_16;
  uint uVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHie.c"
                  ,0x25c,"Abc_Ntk_t *Abc_NtkConvertBlackboxes(Abc_Ntk_t *)");
  }
  if (pNtk->nObjCounts[9] != 0) {
    __assert_fail("Abc_NtkWhiteboxNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHie.c"
                  ,0x25d,"Abc_Ntk_t *Abc_NtkConvertBlackboxes(Abc_Ntk_t *)");
  }
  pNtk_00 = Abc_NtkAlloc(ABC_NTK_NETLIST,pNtk->ntkFunc,1);
  pcVar7 = Extra_UtilStrsav(pNtk->pName);
  pNtk_00->pName = pcVar7;
  pcVar7 = Extra_UtilStrsav(pNtk->pSpec);
  pNtk_00->pSpec = pcVar7;
  Abc_NtkCleanCopy(pNtk);
  lVar11 = extraout_RDX;
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar6 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar6 + 500;
    iVar14 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar14) {
      piVar8 = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = piVar8;
      if (piVar8 == (int *)0x0) goto LAB_001cf7fd;
      (pNtk->vTravIds).nCap = iVar14;
      lVar11 = extraout_RDX_00;
    }
    if (-500 < iVar6) {
      memset((pNtk->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
      lVar11 = extraout_RDX_01;
    }
    (pNtk->vTravIds).nSize = iVar14;
  }
  iVar6 = pNtk->nTravIds;
  pNtk->nTravIds = iVar6 + 1;
  if (iVar6 < 0x3fffffff) {
    pVVar10 = pNtk->vBoxes;
    if (0 < pVVar10->nSize) {
      lVar15 = 0;
      do {
        plVar3 = (long *)pVVar10->pArray[lVar15];
        if ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 10) {
          lVar13 = *plVar3;
          uVar2 = *(undefined4 *)(lVar13 + 0xd8);
          iVar6 = (int)plVar3[2];
          Vec_IntFillExtra((Vec_Int_t *)(lVar13 + 0xe0),iVar6 + 1,(int)lVar11);
          if (((long)iVar6 < 0) || (*(int *)(lVar13 + 0xe4) <= iVar6)) goto LAB_001cf743;
          *(undefined4 *)(*(long *)(lVar13 + 0xe8) + (long)iVar6 * 4) = uVar2;
          lVar11 = extraout_RDX_02;
        }
        lVar15 = lVar15 + 1;
        pVVar10 = pNtk->vBoxes;
      } while (lVar15 < pVVar10->nSize);
    }
    pVVar10 = pNtk->vCis;
    if (0 < pVVar10->nSize) {
      lVar15 = 0;
      do {
        lVar13 = *pVVar10->pArray[lVar15];
        uVar2 = *(undefined4 *)(lVar13 + 0xd8);
        iVar6 = (int)*(long *)((long)pVVar10->pArray[lVar15] + 0x10);
        Vec_IntFillExtra((Vec_Int_t *)(lVar13 + 0xe0),iVar6 + 1,(int)lVar11);
        if (((long)iVar6 < 0) || (*(int *)(lVar13 + 0xe4) <= iVar6)) goto LAB_001cf743;
        *(undefined4 *)(*(long *)(lVar13 + 0xe8) + (long)iVar6 * 4) = uVar2;
        lVar15 = lVar15 + 1;
        pVVar10 = pNtk->vCis;
        lVar11 = extraout_RDX_03;
      } while (lVar15 < pVVar10->nSize);
    }
    pVVar10 = pNtk->vCos;
    if (0 < pVVar10->nSize) {
      lVar15 = 0;
      do {
        lVar13 = *pVVar10->pArray[lVar15];
        uVar2 = *(undefined4 *)(lVar13 + 0xd8);
        iVar6 = (int)*(long *)((long)pVVar10->pArray[lVar15] + 0x10);
        Vec_IntFillExtra((Vec_Int_t *)(lVar13 + 0xe0),iVar6 + 1,(int)lVar11);
        if (((long)iVar6 < 0) || (*(int *)(lVar13 + 0xe4) <= iVar6)) goto LAB_001cf743;
        *(undefined4 *)(*(long *)(lVar13 + 0xe8) + (long)iVar6 * 4) = uVar2;
        lVar15 = lVar15 + 1;
        pVVar10 = pNtk->vCos;
        lVar11 = extraout_RDX_04;
      } while (lVar15 < pVVar10->nSize);
    }
    pVVar10 = pNtk->vPis;
    if (0 < pVVar10->nSize) {
      lVar15 = 0;
      do {
        lVar13 = *pVVar10->pArray[lVar15];
        iVar6 = *(int *)(lVar13 + 0xd8);
        iVar14 = (int)*(long *)((long)pVVar10->pArray[lVar15] + 0x10);
        Vec_IntFillExtra((Vec_Int_t *)(lVar13 + 0xe0),iVar14 + 1,(int)lVar11);
        if (((long)iVar14 < 0) || (*(int *)(lVar13 + 0xe4) <= iVar14)) goto LAB_001cf743;
        *(int *)(*(long *)(lVar13 + 0xe8) + (long)iVar14 * 4) = iVar6 + -1;
        lVar15 = lVar15 + 1;
        pVVar10 = pNtk->vPis;
        lVar11 = extraout_RDX_05;
      } while (lVar15 < pVVar10->nSize);
    }
    pVVar10 = pNtk->vBoxes;
    if (0 < pVVar10->nSize) {
      lVar15 = 0;
      do {
        plVar3 = (long *)pVVar10->pArray[lVar15];
        if ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 8) {
          plVar3 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8
                             );
          lVar13 = *plVar3;
          iVar6 = *(int *)(lVar13 + 0xd8);
          iVar14 = (int)plVar3[2];
          Vec_IntFillExtra((Vec_Int_t *)(lVar13 + 0xe0),iVar14 + 1,(int)lVar11);
          if (((long)iVar14 < 0) || (*(int *)(lVar13 + 0xe4) <= iVar14)) goto LAB_001cf743;
          *(int *)(*(long *)(lVar13 + 0xe8) + (long)iVar14 * 4) = iVar6 + -1;
          lVar11 = extraout_RDX_06;
        }
        lVar15 = lVar15 + 1;
        pVVar10 = pNtk->vBoxes;
      } while (lVar15 < pVVar10->nSize);
    }
    pVVar10 = pNtk->vBoxes;
    if (0 < pVVar10->nSize) {
      lVar15 = 0;
      do {
        plVar3 = (long *)pVVar10->pArray[lVar15];
        if ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 8) {
          plVar3 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[6] * 8
                             );
          lVar13 = *plVar3;
          iVar6 = *(int *)(lVar13 + 0xd8);
          iVar14 = (int)plVar3[2];
          Vec_IntFillExtra((Vec_Int_t *)(lVar13 + 0xe0),iVar14 + 1,(int)lVar11);
          if (((long)iVar14 < 0) || (*(int *)(lVar13 + 0xe4) <= iVar14)) goto LAB_001cf743;
          *(int *)(*(long *)(lVar13 + 0xe8) + (long)iVar14 * 4) = iVar6 + -1;
          lVar11 = extraout_RDX_07;
        }
        lVar15 = lVar15 + 1;
        pVVar10 = pNtk->vBoxes;
      } while (lVar15 < pVVar10->nSize);
    }
    pVVar10 = pNtk->vBoxes;
    if (0 < pVVar10->nSize) {
      lVar15 = 0;
      do {
        plVar3 = (long *)pVVar10->pArray[lVar15];
        if (((*(uint *)((long)plVar3 + 0x14) & 0xf) == 10) && (0 < *(int *)((long)plVar3 + 0x2c))) {
          lVar13 = 0;
          do {
            lVar11 = *(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                              (long)*(int *)(plVar3[6] + lVar13 * 4) * 8);
            pAVar9 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PI);
            *(Abc_Obj_t **)(lVar11 + 0x40) = pAVar9;
            lVar13 = lVar13 + 1;
            lVar11 = extraout_RDX_08;
          } while (lVar13 < *(int *)((long)plVar3 + 0x2c));
        }
        lVar15 = lVar15 + 1;
        pVVar10 = pNtk->vBoxes;
      } while (lVar15 < pVVar10->nSize);
    }
    pVVar10 = pNtk->vObjs;
    if (0 < pVVar10->nSize) {
      lVar15 = 0;
      do {
        pAVar9 = (Abc_Obj_t *)pVVar10->pArray[lVar15];
        if (pAVar9 != (Abc_Obj_t *)0x0) {
          pAVar4 = pAVar9->pNtk;
          iVar6 = pAVar9->Id;
          Vec_IntFillExtra(&pAVar4->vTravIds,iVar6 + 1,(int)lVar11);
          if (((long)iVar6 < 0) || ((pAVar4->vTravIds).nSize <= iVar6)) goto LAB_001cf762;
          lVar11 = extraout_RDX_09;
          if ((pAVar4->vTravIds).pArray[iVar6] != pAVar9->pNtk->nTravIds) {
            Abc_NtkDupObj(pNtk_00,pAVar9,(uint)((*(uint *)&pAVar9->field_0x14 & 0xf) == 6));
            lVar11 = extraout_RDX_10;
          }
        }
        lVar15 = lVar15 + 1;
        pVVar10 = pNtk->vObjs;
      } while (lVar15 < pVVar10->nSize);
    }
    pVVar10 = pNtk->vObjs;
    iVar6 = pVVar10->nSize;
    if (0 < iVar6) {
      lVar15 = 0;
      do {
        plVar3 = (long *)pVVar10->pArray[lVar15];
        if (plVar3 != (long *)0x0) {
          lVar13 = *plVar3;
          iVar6 = (int)plVar3[2];
          Vec_IntFillExtra((Vec_Int_t *)(lVar13 + 0xe0),iVar6 + 1,(int)lVar11);
          if (((long)iVar6 < 0) || (*(int *)(lVar13 + 0xe4) <= iVar6)) goto LAB_001cf762;
          lVar11 = extraout_RDX_11;
          if ((*(int *)(*(long *)(lVar13 + 0xe8) + (long)iVar6 * 4) != *(int *)(*plVar3 + 0xd8)) &&
             (0 < *(int *)((long)plVar3 + 0x1c))) {
            lVar13 = 0;
            do {
              Abc_ObjAddFanin((Abc_Obj_t *)plVar3[8],
                              *(Abc_Obj_t **)
                               (*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                         (long)*(int *)(plVar3[4] + lVar13 * 4) * 8) + 0x40));
              lVar13 = lVar13 + 1;
              lVar11 = extraout_RDX_12;
            } while (lVar13 < *(int *)((long)plVar3 + 0x1c));
          }
        }
        lVar15 = lVar15 + 1;
        pVVar10 = pNtk->vObjs;
        iVar6 = pVVar10->nSize;
      } while (lVar15 < iVar6);
    }
    if ((pNtk->vTravIds).pArray == (int *)0x0) {
      uVar12 = iVar6 + 500;
      if ((pNtk->vTravIds).nCap < (int)uVar12) {
        piVar8 = (int *)malloc((long)(int)uVar12 << 2);
        (pNtk->vTravIds).pArray = piVar8;
        if (piVar8 == (int *)0x0) {
LAB_001cf7fd:
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pNtk->vTravIds).nCap = uVar12;
        lVar11 = extraout_RDX_13;
      }
      if (-500 < iVar6) {
        memset((pNtk->vTravIds).pArray,0,(ulong)uVar12 << 2);
        lVar11 = extraout_RDX_14;
      }
      (pNtk->vTravIds).nSize = uVar12;
    }
    iVar6 = pNtk->nTravIds;
    pNtk->nTravIds = iVar6 + 1;
    if (iVar6 < 0x3fffffff) {
      pVVar10 = pNtk->vCos;
      if (0 < pVVar10->nSize) {
        lVar15 = 0;
        do {
          iVar6 = (int)lVar11;
          plVar3 = (long *)pVVar10->pArray[lVar15];
          if (1 < *(int *)((long)plVar3 + 0x2c)) {
            __assert_fail("Abc_ObjFanoutNum(pTerm) <= 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHie.c"
                          ,0x28c,"Abc_Ntk_t *Abc_NtkConvertBlackboxes(Abc_Ntk_t *)");
          }
          if (*(int *)((long)plVar3 + 0x2c) == 1) {
            iVar6 = *(int *)plVar3[6];
            lVar11 = (long)iVar6;
            if ((*(uint *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + lVar11 * 8) + 0x14)
                & 0xf) != 8) goto LAB_001cf639;
          }
          else {
LAB_001cf639:
            plVar3 = *(long **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                               (long)*(int *)plVar3[4] * 8);
            lVar13 = *plVar3;
            iVar14 = (int)plVar3[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar13 + 0xe0),iVar14 + 1,iVar6);
            if (((long)iVar14 < 0) || (*(int *)(lVar13 + 0xe4) <= iVar14)) {
LAB_001cf762:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            lVar5 = *plVar3;
            iVar6 = *(int *)(lVar5 + 0xd8);
            lVar11 = extraout_RDX_15;
            if (*(int *)(*(long *)(lVar13 + 0xe8) + (long)iVar14 * 4) != iVar6) {
              iVar14 = (int)plVar3[2];
              Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar14 + 1,(int)extraout_RDX_15);
              if (((long)iVar14 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar14)) {
LAB_001cf743:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              *(int *)(*(long *)(lVar5 + 0xe8) + (long)iVar14 * 4) = iVar6;
              pAVar9 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PO);
              Abc_ObjAddFanin(pAVar9,(Abc_Obj_t *)plVar3[8]);
              lVar11 = extraout_RDX_16;
            }
          }
          lVar15 = lVar15 + 1;
          pVVar10 = pNtk->vCos;
        } while (lVar15 < pVVar10->nSize);
      }
      iVar6 = Abc_NtkCheck(pNtk_00);
      if (iVar6 == 0) {
        fwrite("Abc_NtkConvertBlackboxes(): Network check has failed.\n",0x36,1,_stdout);
        Abc_NtkDelete(pNtk_00);
        pNtk_00 = (Abc_Ntk_t *)0x0;
      }
      return pNtk_00;
    }
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkConvertBlackboxes( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pNet, * pFanin, * pTerm;
    int i, k;

    assert( Abc_NtkIsNetlist(pNtk) );
    assert( Abc_NtkWhiteboxNum(pNtk) == 0 );

    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav( pNtk->pName );
    pNtkNew->pSpec = Extra_UtilStrsav( pNtk->pSpec );

    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );

    // mark the nodes that should not be connected
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachBlackbox( pNtk, pObj, i )
        Abc_NodeSetTravIdCurrent( pObj );
    Abc_NtkForEachCi( pNtk, pTerm, i )
        Abc_NodeSetTravIdCurrent( pTerm );
    Abc_NtkForEachCo( pNtk, pTerm, i )
        Abc_NodeSetTravIdCurrent( pTerm );
    // unmark PIs and LIs/LOs
    Abc_NtkForEachPi( pNtk, pTerm, i )
        Abc_NodeSetTravIdPrevious( pTerm );
    Abc_NtkForEachLatchInput( pNtk, pTerm, i )
        Abc_NodeSetTravIdPrevious( pTerm );
    Abc_NtkForEachLatchOutput( pNtk, pTerm, i )
        Abc_NodeSetTravIdPrevious( pTerm );
    // copy the box outputs
    Abc_NtkForEachBlackbox( pNtk, pObj, i )
        Abc_ObjForEachFanout( pObj, pTerm, k )
            pTerm->pCopy = Abc_NtkCreatePi( pNtkNew );

    // duplicate other objects
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_NodeIsTravIdCurrent(pObj) )
            Abc_NtkDupObj( pNtkNew, pObj, Abc_ObjIsNet(pObj) );

    // connect all objects
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_NodeIsTravIdCurrent(pObj) )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );

    // create unique PO for each net feeding into blackboxes or POs
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachCo( pNtk, pTerm, i )
    {
        // skip latch inputs
        assert( Abc_ObjFanoutNum(pTerm) <= 1 );
        if ( Abc_ObjFanoutNum(pTerm) > 0 && Abc_ObjIsLatch(Abc_ObjFanout0(pTerm)) )
            continue;
        // check if the net is visited
        pNet = Abc_ObjFanin0(pTerm);
        if ( Abc_NodeIsTravIdCurrent(pNet) )
            continue;
        // create PO
        Abc_NodeSetTravIdCurrent( pNet );
        Abc_ObjAddFanin( Abc_NtkCreatePo(pNtkNew), pNet->pCopy );
    }

    // check integrity
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        fprintf( stdout, "Abc_NtkConvertBlackboxes(): Network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}